

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_readpage(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  int *piVar4;
  __off_t _Var5;
  ssize_t x;
  LispPTR LVar6;
  LispPTR LVar7;
  DLword *__buf;
  stat sbuf;
  stat local_c0;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    uVar1 = *args;
    if ((uVar1 & 0xfff0000) == 0xf0000) {
      LVar6 = uVar1 | 0xffff0000;
    }
    else if ((uVar1 & 0xfff0000) == 0xe0000) {
      LVar6 = uVar1 & 0xffff;
    }
    else {
      pLVar3 = NativeAligned4FromLAddr(uVar1);
      LVar6 = *pLVar3;
    }
    uVar1 = args[1];
    if ((uVar1 & 0xfff0000) == 0xf0000) {
      LVar7 = uVar1 | 0xffff0000;
    }
    else if ((uVar1 & 0xfff0000) == 0xe0000) {
      LVar7 = uVar1 & 0xffff;
    }
    else {
      pLVar3 = NativeAligned4FromLAddr(uVar1);
      LVar7 = *pLVar3;
    }
    __buf = Lisp_world + args[2];
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      iVar2 = fstat(LVar6,&local_c0);
      if (iVar2 != -1) break;
    } while (*piVar4 == 4);
    alarm(0);
    if (iVar2 != 0) {
      *Lisp_errno = *piVar4;
      return 0;
    }
    if ((local_c0.st_mode & 0xf000) == 0x8000) {
      do {
        alarm(TIMEOUT_TIME);
        do {
          *piVar4 = 0;
          _Var5 = lseek(LVar6,(long)(int)(LVar7 << 9),0);
          if (_Var5 != -1) {
            alarm(0);
            goto LAB_0011b5ea;
          }
        } while (*piVar4 == 4);
        alarm(0);
        iVar2 = *piVar4;
      } while (iVar2 == 4);
    }
    else {
LAB_0011b5ea:
      do {
        alarm(TIMEOUT_TIME);
        do {
          *piVar4 = 0;
          x = read(LVar6,__buf,0x200);
          if (x != -1) {
            alarm(0);
            memset((void *)((long)__buf + x),0,0x200 - x);
            word_swap_page(__buf,0x80);
            LVar6 = GetSmallp(x);
            return LVar6;
          }
        } while (*piVar4 == 4);
        alarm(0);
        iVar2 = *piVar4;
      } while (iVar2 == 4);
    }
    *Lisp_errno = iVar2;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_readpage(LispPTR *args)
{
  char *bufp;
  int fd, npage, rval;
  ssize_t count;
  off_t offval;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (S_ISREG(sbuf.st_mode)) {
  /*
   * The request file is a regular file.  We have to make sure that
   * next byte read is at the beginning of the requested page of the
   * file.  If the request file is special file, lseek is not needed.
   */
  sklp:
    TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
    if (offval == -1) {
      if (errno == EINTR) goto sklp; /* interrupted, retry */
      *Lisp_errno = errno;
      return (NIL);
    }
  }

rdlp:
  TIMEOUT(count = read(fd, bufp, FDEV_PAGE_SIZE));
  if (count == -1) {
    if (errno == EINTR) goto rdlp; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

  /* O out the remaining part of the buffer. */
  memset(&bufp[count], 0, FDEV_PAGE_SIZE - count);

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, FDEV_PAGE_SIZE / 4);
#endif /* BYTESWAP */

  return (GetSmallp(count));
}